

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinder.h
# Opt level: O0

ParameterDeclarationSymbol * __thiscall
psy::C::DeclarationBinder::bindDeclaration<psy::C::ParameterDeclarationSymbol>
          (DeclarationBinder *this,SyntaxNode *node)

{
  SyntaxTree *tree;
  SemanticModel *this_00;
  unique_ptr<psy::C::ParameterDeclarationSymbol,_std::default_delete<psy::C::ParameterDeclarationSymbol>_>
  node_00;
  ParameterDeclarationSymbol *pPVar1;
  Symbol *containingSym;
  reference ppSVar2;
  unique_ptr<psy::C::DeclarationSymbol,_std::default_delete<psy::C::DeclarationSymbol>_> local_40;
  ParameterDeclarationSymbol *local_38;
  ParameterDeclarationSymbol *decl;
  unique_ptr<psy::C::ParameterDeclarationSymbol,_std::default_delete<psy::C::ParameterDeclarationSymbol>_>
  local_20;
  unique_ptr<psy::C::ParameterDeclarationSymbol,_std::default_delete<psy::C::ParameterDeclarationSymbol>_>
  newDecl;
  SyntaxNode *node_local;
  DeclarationBinder *this_local;
  
  newDecl._M_t.
  super___uniq_ptr_impl<psy::C::ParameterDeclarationSymbol,_std::default_delete<psy::C::ParameterDeclarationSymbol>_>
  ._M_t.
  super__Tuple_impl<0UL,_psy::C::ParameterDeclarationSymbol_*,_std::default_delete<psy::C::ParameterDeclarationSymbol>_>
  .super__Head_base<0UL,_psy::C::ParameterDeclarationSymbol_*,_false>._M_head_impl =
       (__uniq_ptr_data<psy::C::ParameterDeclarationSymbol,_std::default_delete<psy::C::ParameterDeclarationSymbol>,_true,_true>
        )(__uniq_ptr_data<psy::C::ParameterDeclarationSymbol,_std::default_delete<psy::C::ParameterDeclarationSymbol>,_true,_true>
          )node;
  pPVar1 = (ParameterDeclarationSymbol *)operator_new(0x20);
  containingSym = containingUnitOrDeclaration(this);
  tree = (this->super_SyntaxVisitor).tree_;
  ppSVar2 = std::
            stack<psy::C::Scope_*,_std::deque<psy::C::Scope_*,_std::allocator<psy::C::Scope_*>_>_>::
            top(&this->scopes_);
  ParameterDeclarationSymbol::ParameterDeclarationSymbol(pPVar1,containingSym,tree,*ppSVar2);
  std::
  unique_ptr<psy::C::ParameterDeclarationSymbol,std::default_delete<psy::C::ParameterDeclarationSymbol>>
  ::unique_ptr<std::default_delete<psy::C::ParameterDeclarationSymbol>,void>
            ((unique_ptr<psy::C::ParameterDeclarationSymbol,std::default_delete<psy::C::ParameterDeclarationSymbol>>
              *)&local_20,pPVar1);
  node_00 = newDecl;
  this_00 = this->semaModel_;
  std::unique_ptr<psy::C::DeclarationSymbol,std::default_delete<psy::C::DeclarationSymbol>>::
  unique_ptr<psy::C::ParameterDeclarationSymbol,std::default_delete<psy::C::ParameterDeclarationSymbol>,void>
            ((unique_ptr<psy::C::DeclarationSymbol,std::default_delete<psy::C::DeclarationSymbol>> *
             )&local_40,&local_20);
  pPVar1 = (ParameterDeclarationSymbol *)
           SemanticModel::addDeclaration
                     (this_00,(SyntaxNode *)
                              node_00._M_t.
                              super___uniq_ptr_impl<psy::C::ParameterDeclarationSymbol,_std::default_delete<psy::C::ParameterDeclarationSymbol>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_psy::C::ParameterDeclarationSymbol_*,_std::default_delete<psy::C::ParameterDeclarationSymbol>_>
                              .super__Head_base<0UL,_psy::C::ParameterDeclarationSymbol_*,_false>.
                              _M_head_impl,&local_40);
  std::unique_ptr<psy::C::DeclarationSymbol,_std::default_delete<psy::C::DeclarationSymbol>_>::
  ~unique_ptr(&local_40);
  local_38 = pPVar1;
  pushDeclaration(this,(DeclarationSymbol *)pPVar1);
  pPVar1 = local_38;
  std::
  unique_ptr<psy::C::ParameterDeclarationSymbol,_std::default_delete<psy::C::ParameterDeclarationSymbol>_>
  ::~unique_ptr(&local_20);
  return pPVar1;
}

Assistant:

DeclSymT* DeclarationBinder::bindDeclaration(const SyntaxNode* node, DeclSymTArgs... args)
{
    std::unique_ptr<DeclSymT> newDecl(
                new DeclSymT(containingUnitOrDeclaration(),
                             tree_,
                             scopes_.top(),
                             std::forward<DeclSymTArgs>(args)...));
    auto decl = static_cast<DeclSymT*>(semaModel_->addDeclaration(node, std::move(newDecl)));
    pushDeclaration(decl);
    return decl;
}